

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_4,_4>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_4,_4>_> *this,EvalContext *ctx)

{
  bool *pbVar1;
  bool *pbVar2;
  Environment *this_00;
  Variable<tcu::Matrix<float,_4,_4>_> *variable;
  Expr<tcu::Matrix<float,_4,_4>_> *pEVar3;
  double dVar4;
  Interval *pIVar5;
  int row;
  long lVar6;
  long lVar7;
  Interval *pIVar8;
  IVal local_1a0;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
               .m_ptr;
    pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_ExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(&local_1a0,pEVar3,ctx);
    Environment::bind<tcu::Matrix<float,4,4>>(this_00,variable,&local_1a0);
  }
  else {
    pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_ExprPBase<tcu::Matrix<float,_4,_4>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr;
    pIVar8 = (Interval *)&local_1a0;
    (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pIVar8,pEVar3,ctx);
    pIVar5 = (Interval *)
             Environment::lookup<tcu::Matrix<float,4,4>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                                 .m_ptr);
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&pIVar5->m_hi + lVar7) = *(undefined8 *)((long)&pIVar8->m_hi + lVar7);
        pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar8->m_hasNaN)->m_data[0].m_data
                  [0].m_hasNaN + lVar7;
        dVar4 = *(double *)(pbVar1 + 8);
        pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar5->m_hasNaN)->m_data[0].m_data
                  [0].m_hasNaN + lVar7;
        *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
        *(double *)(pbVar2 + 8) = dVar4;
        lVar7 = lVar7 + 0x60;
      } while (lVar7 != 0x180);
      lVar6 = lVar6 + 1;
      pIVar5 = pIVar5 + 1;
      pIVar8 = pIVar8 + 1;
    } while (lVar6 != 4);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}